

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Display.cxx
# Opt level: O2

void __thiscall Fl_Text_Display::update_h_scrollbar(Fl_Text_Display *this)

{
  int size;
  int iVar1;
  int total;
  
  iVar1 = longest_vline(this);
  size = (this->text_area).w;
  total = this->mHorizOffset + size;
  if (total < iVar1) {
    total = iVar1;
  }
  Fl_Slider::scrollvalue(&this->mHScrollBar->super_Fl_Slider,this->mHorizOffset,size,0,total);
  return;
}

Assistant:

void Fl_Text_Display::update_h_scrollbar() {
  int sliderMax = max(longest_vline(), text_area.w + mHorizOffset);
  mHScrollBar->value( mHorizOffset, text_area.w, 0, sliderMax );
}